

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O0

void print_hwinfo(void)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint local_38;
  uint local_34;
  uint32_t j;
  uint32_t i;
  uint32_t size;
  uint32_t ctx_size;
  uint32_t tpc_size;
  uint32_t tpc_base;
  uint32_t tpc_cnt;
  uint32_t smx_cnt;
  uint32_t gpc_base;
  uint32_t gpc_area;
  uint32_t gpc_size;
  uint32_t gpc_cnt;
  
  printf("Card: NV%X\n",(ulong)dev);
  uVar1 = nva_rd32(cnum,0x418bb8);
  printf("SM  count             : %d\n",(ulong)(uVar1 >> 8 & 0xff));
  uVar1 = nva_rd32(cnum,0x22430);
  printf("GPC count             : %d\n",(ulong)uVar1);
  gpc_base = 0;
  smx_cnt = 0;
  for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
    iVar2 = local_34 * 0x8000;
    uVar3 = nva_rd32(cnum,iVar2 + 0x502608);
    printf("  GPC[%2u] TPCs        : %d\n",(ulong)local_34,(ulong)(uVar3 & 0x1f));
    uVar4 = nva_rd32(cnum,iVar2 + 0x50274c);
    printf("  GPC[%2u] base size   : %d bytes\n",(ulong)local_34,(ulong)(uVar4 * 4));
    uVar5 = ctxsize_strands(iVar2 + 0x500000);
    printf("  GPC[%2u] strand size : %d bytes\n",(ulong)local_34,(ulong)uVar5);
    i = uVar5 + uVar4 * 4;
    if (0x106 < dev) {
      size = 0;
      for (local_38 = 0; local_38 < (uVar3 & 0x1f); local_38 = local_38 + 1) {
        uVar4 = ctxsize_tpc_strands(iVar2 + 0x504000 + local_38 * 0x800);
        printf("    TPC[%2u] strands   : %d bytes\n",(ulong)local_38,(ulong)uVar4);
        size = uVar4 + size;
      }
      printf("  GPC[%2u] TPC size    : %d bytes\n",(ulong)local_34,(ulong)size);
      i = size + i;
    }
    printf("  GPC[%2u] ctx size    : %d bytes\n",(ulong)local_34,(ulong)i);
    gpc_base = i + gpc_base;
    uVar3 = nva_rd32(cnum,local_34 * 0x8000 + 0x502804);
    printf("  GPC[%2u] ctx area    : %d bytes\n",(ulong)local_34,(ulong)uVar3);
    smx_cnt = uVar3 + smx_cnt;
  }
  printf("GPC context size      : %d bytes\n",(ulong)gpc_base);
  nva_rd32(cnum,0x41a804);
  printf("GPC context area      : %d bytes\n",(ulong)smx_cnt);
  printf("\n");
  uVar1 = nva_rd32(cnum,0x40974c);
  uVar3 = ctxsize_strands(0x407000);
  uVar6 = uVar3 + uVar1 * 4;
  printf("HUB context size      : %d bytes\n",(ulong)uVar6);
  printf("Total context size    : %d bytes\n",(ulong)(uVar6 + gpc_base));
  uVar1 = nva_rd32(cnum,0x409804);
  printf("Total context area    : %d bytes\n",(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void print_hwinfo()
{
	uint32_t gpc_cnt, gpc_size, gpc_area, gpc_base, smx_cnt, tpc_cnt, tpc_base,
				tpc_size, ctx_size, size, i, j;

	printf("Card: NV%X\n", dev);

	smx_cnt = (nva_rd32(cnum, 0x418bb8) >> 8) & 0xff;
	printf("SM  count             : %d\n", smx_cnt);

	gpc_cnt = nva_rd32(cnum, 0x22430);
	printf("GPC count             : %d\n", gpc_cnt);

	gpc_size = 0;
	gpc_area = 0;
	for (i = 0; i < gpc_cnt; i++) {
		gpc_base = 0x500000 + (i * 0x8000);
		tpc_cnt = nva_rd32(cnum, gpc_base + 0x2608) & 0x1f;
		printf("  GPC[%2u] TPCs        : %d\n", i, tpc_cnt);
		ctx_size = nva_rd32(cnum, gpc_base + 0x274c) << 2;
		printf("  GPC[%2u] base size   : %d bytes\n", i, ctx_size);
		size = ctxsize_strands(gpc_base);
		printf("  GPC[%2u] strand size : %d bytes\n", i, size);
		ctx_size += size;
		if (dev >= 0x107) {
			tpc_size = 0;
			for (j = 0; j < tpc_cnt; j++) {
				size = 0;
				tpc_base = gpc_base + 0x4000 + (j * 0x800);
				size = ctxsize_tpc_strands(tpc_base);
				printf("    TPC[%2u] strands   : %d bytes\n", j, size);
				tpc_size += size;
			}
			printf("  GPC[%2u] TPC size    : %d bytes\n", i, tpc_size);
			ctx_size += tpc_size;
		}
		printf("  GPC[%2u] ctx size    : %d bytes\n", i, ctx_size);
		gpc_size += ctx_size;

		ctx_size = nva_rd32(cnum, 0x502804 + (i * 0x8000));
		printf("  GPC[%2u] ctx area    : %d bytes\n", i, ctx_size);
		gpc_area += ctx_size;
	}

	printf("GPC context size      : %d bytes\n", gpc_size);

	ctx_size = nva_rd32(cnum, 0x41a804);
	printf("GPC context area      : %d bytes\n", gpc_area);
	printf("\n");

	ctx_size = nva_rd32(cnum,0x40974c) << 2;
	ctx_size += ctxsize_strands(0x407000);
	printf("HUB context size      : %d bytes\n", ctx_size);

	printf("Total context size    : %d bytes\n", ctx_size + gpc_size);

	ctx_size = nva_rd32(cnum, 0x409804);
	printf("Total context area    : %d bytes\n", ctx_size);

	printf("\n");
}